

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O1

bool __thiscall
opts::BasicOption::parse(BasicOption *this,int argc,char **argv,int *i,int j,IsShort *is_short)

{
  char *__s;
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  long *plVar5;
  char *pcVar6;
  allocator<char> local_71;
  long *local_70 [2];
  long local_60 [2];
  _Any_data local_50;
  code *local_40;
  
  iVar3 = *i;
  __s = argv[iVar3];
  pcVar6 = __s + j;
  if (__s[j] == '=') {
    pcVar6 = pcVar6 + 1;
  }
  else if (__s[j] == '\0') {
    if (iVar3 + 1 < argc) {
      pcVar6 = argv[(long)iVar3 + 1];
      if (*pcVar6 == '-') {
        std::function<bool_(char)>::function((function<bool_(char)> *)&local_50,is_short);
        bVar2 = Options::dashed_non_option(pcVar6,(IsShort *)&local_50);
        bVar1 = true;
      }
      else {
        bVar2 = true;
        bVar1 = false;
      }
    }
    else {
      bVar1 = false;
      bVar2 = false;
    }
    if ((bVar1) && (local_40 != (code *)0x0)) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
    if (bVar2 == false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"error: cannot find the argument; ignoring ",0x2a);
      pcVar6 = argv[*i];
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1505b8);
      }
      else {
        sVar4 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,sVar4);
      }
      plVar5 = &std::cerr;
LAB_00108524:
      local_71 = (allocator<char>)0xa;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)plVar5,(char *)&local_71,1);
      return false;
    }
    iVar3 = *i;
    *i = iVar3 + 1;
    pcVar6 = argv[(long)iVar3 + 1];
  }
  else if (j != 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"error: unexpected character \'",0x1d);
    local_71 = *(allocator<char> *)(argv[*i] + j);
    plVar5 = (long *)std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)&local_71,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)plVar5,"\' ignoring ",0xb);
    pcVar6 = argv[*i];
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)plVar5 + (int)*(undefined8 *)(*plVar5 + -0x18));
    }
    else {
      sVar4 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)plVar5,pcVar6,sVar4);
    }
    goto LAB_00108524;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)local_70,pcVar6,&local_71);
  iVar3 = (*this->_vptr_BasicOption[4])(this,local_70);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if ((char)iVar3 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"error: failed to parse ",0x17);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1505b8);
    }
    else {
      sVar4 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1505b8);
    }
    else {
      sVar4 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar4);
    }
    local_71 = (allocator<char>)0xa;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,(char *)&local_71,1);
  }
  return (bool)(char)iVar3;
}

Assistant:

bool
BasicOption::parse(int argc, char** argv, int& i, int j, IsShort is_short)
{
    char* argument;
    char* cur_arg = argv[i];
    // -v...
    if (argv[i][j] == '\0')
    {
        // -v data
        if (i + 1 < argc && (argv[i+1][0] != '-' || Options::dashed_non_option(argv[i+1], is_short)))
        {
            ++i;
            argument = argv[i];
        } else
        {
            std::cerr << "error: cannot find the argument; ignoring " << argv[i] << '\n';
            return false;
        }
    } else if (argv[i][j] == '=')
    {
        // -v=data
        argument = &argv[i][j+1];
    } else if( j == 2 ) { // only for short options
        // -vdata
        argument = &argv[i][j];
    } else
    {
        std::cerr << "error: unexpected character \'" << argv[i][j] << "\' ignoring " << argv[i] << '\n';
        return false;
    }
    bool result = set(argument);
    if (!result)
        std::cerr << "error: failed to parse " << argument << " in " << cur_arg << '\n';
    return result;
}